

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O2

void av1_lowbd_fwd_txfm2d_8x8_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  code *pcVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  bool bVar8;
  int8_t *piVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  undefined7 in_register_00000009;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 local_138 [16];
  undefined1 auStack_128 [16];
  undefined1 local_118 [16];
  undefined1 auStack_108 [16];
  undefined1 local_f8 [16];
  undefined1 auStack_e8 [16];
  undefined1 local_d8 [16];
  undefined1 auStack_c8 [16];
  undefined1 local_b8 [16];
  undefined1 auStack_a8 [16];
  undefined1 local_98 [16];
  undefined1 auStack_88 [16];
  undefined1 local_78 [16];
  undefined1 auStack_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  piVar9 = av1_fwd_txfm_shift_ls[1];
  uVar10 = (uint)CONCAT71(in_register_00000009,tx_type);
  bVar8 = false;
  if (uVar10 < 0x10) {
    if ((0x4110U >> (uVar10 & 0x1f) & 1) != 0) {
LAB_003d3cda:
      uVar12 = (uint)*av1_fwd_txfm_shift_ls[1];
      auStack_c8 = vpsllw_avx(*(undefined1 (*) [16])input,ZEXT416(uVar12));
      local_d8 = vpsllw_avx(*(undefined1 (*) [16])(input + stride),ZEXT416(uVar12));
      auVar15 = ZEXT416(uVar12);
      auStack_e8 = vpsllw_avx(*(undefined1 (*) [16])(input + stride * 2),auVar15);
      local_f8 = vpsllw_avx(*(undefined1 (*) [16])(input + stride * 3),auVar15);
      auStack_108 = vpsllw_avx(*(undefined1 (*) [16])(input + stride * 4),auVar15);
      local_118 = vpsllw_avx(*(undefined1 (*) [16])(input + stride * 5),auVar15);
      auStack_128 = vpsllw_avx(*(undefined1 (*) [16])(input + stride * 6),ZEXT416(uVar12));
      local_138 = vpsllw_avx(*(undefined1 (*) [16])(input + stride * 7),ZEXT416(uVar12));
      goto LAB_003d3d95;
    }
    if ((0x80a0U >> (uVar10 & 0x1f) & 1) == 0) {
      if (uVar10 == 6) {
        bVar8 = true;
        goto LAB_003d3cda;
      }
    }
    else {
      bVar8 = true;
    }
  }
  uVar12 = (uint)*av1_fwd_txfm_shift_ls[1];
  local_138 = vpsllw_avx(*(undefined1 (*) [16])input,ZEXT416(uVar12));
  auStack_128 = vpsllw_avx(*(undefined1 (*) [16])(input + stride),ZEXT416(uVar12));
  auVar15 = ZEXT416(uVar12);
  local_118 = vpsllw_avx(*(undefined1 (*) [16])(input + stride * 2),auVar15);
  auStack_108 = vpsllw_avx(*(undefined1 (*) [16])(input + stride * 3),auVar15);
  local_f8 = vpsllw_avx(*(undefined1 (*) [16])(input + stride * 4),auVar15);
  auStack_e8 = vpsllw_avx(*(undefined1 (*) [16])(input + stride * 5),auVar15);
  local_d8 = vpsllw_avx(*(undefined1 (*) [16])(input + stride * 6),ZEXT416(uVar12));
  auStack_c8 = vpsllw_avx(*(undefined1 (*) [16])(input + stride * 7),ZEXT416(uVar12));
LAB_003d3d95:
  pcVar1 = *(code **)((long)row_txfm8x8_arr + (ulong)(uVar10 * 8));
  (**(code **)((long)col_txfm8x8_arr + (ulong)(uVar10 * 8)))(local_138,local_138,0xd);
  uVar10 = -(int)piVar9[1];
  auVar13._0_2_ = (undefined2)(1 << (~piVar9[1] & 0x1fU));
  auVar13._2_2_ = auVar13._0_2_;
  auVar13._4_2_ = auVar13._0_2_;
  auVar13._6_2_ = auVar13._0_2_;
  auVar13._8_2_ = auVar13._0_2_;
  auVar13._10_2_ = auVar13._0_2_;
  auVar13._12_2_ = auVar13._0_2_;
  auVar13._14_2_ = auVar13._0_2_;
  auVar13._16_2_ = auVar13._0_2_;
  auVar13._18_2_ = auVar13._0_2_;
  auVar13._20_2_ = auVar13._0_2_;
  auVar13._22_2_ = auVar13._0_2_;
  auVar13._24_2_ = auVar13._0_2_;
  auVar13._26_2_ = auVar13._0_2_;
  auVar13._28_2_ = auVar13._0_2_;
  auVar13._30_2_ = auVar13._0_2_;
  auVar4._16_16_ = auStack_128;
  auVar4._0_16_ = local_138;
  auVar5._16_16_ = local_118;
  auVar5._0_16_ = auStack_128;
  auVar6._16_16_ = auStack_108;
  auVar6._0_16_ = local_118;
  auVar2._16_16_ = auStack_e8;
  auVar2._0_16_ = local_f8;
  auVar4 = vperm2i128_avx2(auVar4,auVar2,0x20);
  auVar3._16_16_ = local_d8;
  auVar3._0_16_ = auStack_e8;
  auVar5 = vperm2i128_avx2(auVar5,auVar3,0x20);
  auVar7._16_16_ = auStack_c8;
  auVar7._0_16_ = local_d8;
  auVar6 = vperm2i128_avx2(auVar6,auVar7,0x20);
  auVar14._0_16_ = ZEXT116(0) * auStack_c8 + ZEXT116(1) * auStack_108;
  auVar14._16_16_ = ZEXT116(0) * local_f8 + ZEXT116(1) * auStack_c8;
  auVar4 = vpaddsw_avx2(auVar4,auVar13);
  auVar5 = vpaddsw_avx2(auVar5,auVar13);
  auVar6 = vpaddsw_avx2(auVar6,auVar13);
  auVar2 = vpsraw_avx2(auVar4,ZEXT416(uVar10));
  auVar5 = vpsraw_avx2(auVar5,ZEXT416(uVar10));
  auVar6 = vpsraw_avx2(auVar6,ZEXT416(uVar10));
  auVar4 = vpaddsw_avx2(auVar14,auVar13);
  auVar4 = vpsraw_avx2(auVar4,ZEXT416(uVar10));
  auVar3 = vpunpcklwd_avx2(auVar2,auVar5);
  auVar5 = vpunpckhwd_avx2(auVar2,auVar5);
  auVar2 = vpunpcklwd_avx2(auVar6,auVar4);
  auVar4 = vpunpckhwd_avx2(auVar6,auVar4);
  auVar6 = vpunpckldq_avx2(auVar3,auVar2);
  auVar7 = vpermq_avx2(auVar6,0xd8);
  auVar6 = vpunpckhdq_avx2(auVar3,auVar2);
  auVar2 = vpermq_avx2(auVar6,0xd8);
  auVar6 = vpunpckldq_avx2(auVar5,auVar4);
  auVar6 = vpermq_avx2(auVar6,0xd8);
  auVar4 = vpunpckhdq_avx2(auVar5,auVar4);
  auVar4 = vpermq_avx2(auVar4,0xd8);
  if (bVar8) {
    local_58 = auVar7._16_16_;
    auVar5 = vpermq_avx2(auVar2,0x4e);
    local_78 = auVar5._0_16_;
    auStack_68 = auVar5._16_16_;
    auVar5 = vpermq_avx2(auVar6,0x4e);
    local_98 = auVar5._0_16_;
    auStack_88 = auVar5._16_16_;
    auVar4 = vpermq_avx2(auVar4,0x4e);
    local_b8 = auVar4._0_16_;
    auStack_a8 = auVar4._16_16_;
    local_48 = auVar7._0_16_;
  }
  else {
    auVar5 = vperm2i128_avx2(auVar7,auVar2,0x21);
    auStack_a8 = auVar5._0_16_;
    local_98 = auVar5._16_16_;
    auVar5 = vperm2i128_avx2(auVar2,auVar6,0x21);
    auStack_88 = auVar5._0_16_;
    local_78 = auVar5._16_16_;
    auStack_68 = auVar6._16_16_;
    local_58 = auVar4._0_16_;
    local_48 = auVar4._16_16_;
    local_b8 = auVar7._0_16_;
  }
  (*pcVar1)(local_b8,local_b8,0xd);
  for (lVar11 = 0; lVar11 != 0x80; lVar11 = lVar11 + 0x10) {
    auVar4 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_b8 + lVar11));
    *(undefined1 (*) [32])((long)output + lVar11 * 2) = auVar4;
  }
  return;
}

Assistant:

static void av1_lowbd_fwd_txfm2d_8x8_avx2(const int16_t *input, int32_t *output,
                                          int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[8], buf1[8], *buf;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X8];
  const int txw_idx = get_txw_idx(TX_8X8);
  const int txh_idx = get_txh_idx(TX_8X8);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const transform_1d_sse2 col_txfm = col_txfm8x8_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x8_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  // Condition to check shift bit is avoided while round shifting, by assuming
  // that shift[0] will always be positive.
  assert(shift[0] > 0);
  if (ud_flip)
    load_buffer_and_flip_round_shift(input, stride, buf0, shift[0]);
  else
    load_buffer_and_round_shift(input, stride, buf0, shift[0]);

  col_txfm(buf0, buf0, cos_bit_col);
  // Condition to check shift bit is avoided while round shifting, by assuming
  // that shift[1] will always be negative.
  assert(shift[1] < 0);

  if (lr_flip) {
    transpose_round_shift_flip_8x8(buf0, buf1, shift[1]);
  } else {
    transpose_round_shift_8x8(buf0, buf1, shift[1]);
  }

  buf = buf1;
  row_txfm(buf, buf, cos_bit_row);

  // Round and shift operation is avoided here as the shift bit is assumed to be
  // zero always.
  assert(shift[2] == 0);
  store_buffer_16bit_to_32bit_w8_avx2(buf, output, 8, 8);
}